

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_59f30e::ResolvePath(anon_unknown_dwarf_59f30e *this,Value *json,Args path)

{
  optional<(anonymous_namespace)::Args> errorPath;
  optional<(anonymous_namespace)::Args> errorPath_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_00;
  bool bVar1;
  ArrayIndex max;
  int index_00;
  ValueType type;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  json_error *pjVar4;
  _Storage<(anonymous_namespace)::Args,_true> local_250;
  undefined8 local_240;
  string_view local_238;
  string_view local_228;
  string_view local_218;
  string_view local_208;
  undefined1 local_1f8 [16];
  string_view local_1e8;
  undefined1 local_1d8 [16];
  string_view local_1c8;
  string_view local_1b8;
  iterator local_1a8;
  size_type local_1a0;
  string_view local_198;
  size_t local_188;
  char *pcStack_180;
  undefined1 local_170 [8];
  string progressStr_1;
  undefined8 uStack_148;
  undefined8 local_140;
  string_view local_108;
  undefined1 local_f8 [16];
  string_view local_e8;
  iterator local_d8;
  size_type local_d0;
  string_view local_c8;
  size_t local_b8;
  char *pcStack_b0;
  undefined1 local_a0 [8];
  string progressStr;
  int index;
  undefined1 local_50 [8];
  Args progress;
  string *field;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  curr;
  Value *search;
  Value *json_local;
  Args path_local;
  
  path_local.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .Begin = path.
           super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .Begin._M_current;
  curr._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  json_local = json;
  local_30 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&json_local);
  do {
    field = (string *)
            cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&json_local);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&field);
    if (!bVar1) {
      return (Value *)curr._M_current;
    }
    progress.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&local_30);
    _Var2 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&json_local);
    _Var3 = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator+(&local_30,1);
    Args::cmRange((Args *)local_50,_Var2,_Var3);
    bVar1 = Json::Value::isArray((Value *)curr._M_current);
    _Var2 = progress.
            super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .End;
    if (bVar1) {
      std::optional<(anonymous_namespace)::Args>::optional<(anonymous_namespace)::Args_&,_true>
                ((optional<(anonymous_namespace)::Args> *)((long)&progressStr.field_2 + 8),
                 (Args *)local_50);
      max = Json::Value::size((Value *)curr._M_current);
      index_00 = ParseIndex(_Var2._M_current,
                            (optional<(anonymous_namespace)::Args> *)
                            ((long)&progressStr.field_2 + 8),max);
      curr._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Json::Value::operator[](curr._M_current,index_00);
    }
    else {
      bVar1 = Json::Value::isObject((Value *)curr._M_current);
      if (!bVar1) {
        local_198 = (string_view)::cm::operator____s(" ",1);
        local_188 = local_198._M_len;
        pcStack_180 = local_198._M_str;
        cmJoin<(anonymous_namespace)::Args>((string *)local_170,(Args *)local_50,local_198);
        pjVar4 = (json_error *)__cxa_allocate_exception(0x28);
        local_218 = (string_view)::cm::operator____s("invalid path \'",0xe);
        local_208 = local_218;
        local_1f8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_170);
        local_228 = (string_view)
                    ::cm::operator____s("\', need element of OBJECT or ARRAY type to lookup \'",0x33
                                       );
        local_1e8 = local_228;
        local_1d8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)
                               progress.
                               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               .End._M_current);
        local_238 = (string_view)::cm::operator____s("\' got ",6);
        local_1c8 = local_238;
        type = Json::Value::type((Value *)curr._M_current);
        local_1b8 = JsonTypeToString(type);
        local_1a8 = &local_208;
        local_1a0 = 6;
        std::optional<(anonymous_namespace)::Args>::optional<(anonymous_namespace)::Args_&,_true>
                  ((optional<(anonymous_namespace)::Args> *)&local_250._M_value,(Args *)local_50);
        message._M_len = local_1a0;
        message._M_array = local_1a8;
        errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current =
             local_250._M_value.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .End._M_current;
        errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current =
             local_250._M_value.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .Begin._M_current;
        errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = local_240;
        json_error::json_error(pjVar4,message,errorPath_00);
        __cxa_throw(pjVar4,&(anonymous_namespace)::json_error::typeinfo,json_error::~json_error);
      }
      bVar1 = Json::Value::isMember
                        ((Value *)curr._M_current,
                         progress.
                         super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .End._M_current);
      if (!bVar1) {
        local_c8 = (string_view)::cm::operator____s(" ",1);
        local_b8 = local_c8._M_len;
        pcStack_b0 = local_c8._M_str;
        cmJoin<(anonymous_namespace)::Args>((string *)local_a0,(Args *)local_50,local_c8);
        pjVar4 = (json_error *)__cxa_allocate_exception(0x28);
        local_108 = (string_view)::cm::operator____s("member \'",8);
        local_f8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a0);
        local_e8 = (string_view)::cm::operator____s("\' not found",0xb);
        local_d8 = &local_108;
        local_d0 = 3;
        std::optional<(anonymous_namespace)::Args>::optional<(anonymous_namespace)::Args_&,_true>
                  ((optional<(anonymous_namespace)::Args> *)((long)&progressStr_1.field_2 + 8),
                   (Args *)local_50);
        message_00._M_len = local_d0;
        message_00._M_array = local_d8;
        errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current =
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )uStack_148;
        errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current =
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )progressStr_1.field_2._8_8_;
        errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
        super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = local_140;
        json_error::json_error(pjVar4,message_00,errorPath);
        __cxa_throw(pjVar4,&(anonymous_namespace)::json_error::typeinfo,json_error::~json_error);
      }
      curr._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Json::Value::operator[]
                     (curr._M_current,
                      progress.
                      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .End._M_current);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

Json::Value& ResolvePath(Json::Value& json, Args path)
{
  Json::Value* search = &json;

  for (auto curr = path.begin(); curr != path.end(); ++curr) {
    const std::string& field = *curr;
    Args progress{ path.begin(), curr + 1 };

    if (search->isArray()) {
      auto index = ParseIndex(field, progress, search->size());
      search = &(*search)[index];

    } else if (search->isObject()) {
      if (!search->isMember(field)) {
        const auto progressStr = cmJoin(progress, " "_s);
        throw json_error({ "member '"_s, progressStr, "' not found"_s },
                         progress);
      }
      search = &(*search)[field];
    } else {
      const auto progressStr = cmJoin(progress, " "_s);
      throw json_error(
        { "invalid path '"_s, progressStr,
          "', need element of OBJECT or ARRAY type to lookup '"_s, field,
          "' got "_s, JsonTypeToString(search->type()) },
        progress);
    }
  }
  return *search;
}